

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

QRhiWidgetPrivate * __thiscall QRhiWidgetPrivate::grabFramebuffer(QRhiWidgetPrivate *this)

{
  int iVar1;
  int iVar2;
  QRhiWidget *pQVar3;
  QRhi *pQVar4;
  QRhiReadbackDescription *pQVar5;
  ulong uVar6;
  QRhiWidgetPrivate *in_RSI;
  QRhiWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar7;
  Format imageFormat;
  QRhiResourceUpdateBatch *readbackBatch;
  bool canRender;
  QRhiWidget *q;
  QImage *result;
  QImage wrapperImage;
  bool needsInit;
  bool readCompleted;
  QRhiReadbackResult readResult;
  QRhiCommandBuffer *cb;
  char *in_stack_fffffffffffffe58;
  Orientation flags;
  QRhiReadbackResult *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  QMessageLogger *in_stack_fffffffffffffe70;
  QRhiTexture *local_180;
  QRhiWidgetPrivate *in_stack_fffffffffffffe88;
  QFlagsStorage<Qt::Orientation> orient;
  QRhiWidgetPrivate *this_00;
  Format local_144;
  bool local_131;
  QRhiWidgetPrivate *changed;
  QRhiWidgetPrivate *this_01;
  QImage local_108 [32];
  QImage local_e8 [24];
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 local_b4 [4];
  undefined1 local_b0 [46];
  byte local_82;
  byte local_81;
  undefined1 local_80 [76];
  undefined1 local_34 [4];
  QRhiResourceUpdateBatch *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  changed = in_RSI;
  this_01 = in_RDI;
  pQVar3 = q_func(in_RSI);
  if ((in_RSI->noSize & 1U) == 0) {
    ensureRhi(in_stack_fffffffffffffe88);
    orient.i = (Int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if (in_RSI->rhi == (QRhi *)0x0) {
      QBackingStoreRhiSupport::setConfig(&in_RSI->offscreenRenderer,&in_RSI->config);
      QBackingStoreRhiSupport::create();
      pQVar4 = QBackingStoreRhiSupport::rhi(&in_RSI->offscreenRenderer);
      in_RSI->rhi = pQVar4;
      if (in_RSI->rhi == (QRhi *)0x0) {
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe70,
                   (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),in_stack_fffffffffffffe58);
        QMessageLogger::warning(local_28,"QRhiWidget: Failed to create dedicated QRhi for grabbing")
        ;
        QRhiWidget::renderFailed((QRhiWidget *)0x349429);
        QImage::QImage((QImage *)this_00);
        goto LAB_0034986f;
      }
    }
    local_30 = (QRhiResourceUpdateBatch *)0x0;
    pQVar4 = in_RSI->rhi;
    memset(local_34,0,4);
    QFlags<QRhi::BeginFrameFlag>::QFlags((QFlags<QRhi::BeginFrameFlag> *)0x349478);
    iVar1 = QRhi::beginOffscreenFrame((QRhiCommandBuffer **)pQVar4,(QFlags_conflict1 *)&local_30);
    if (iVar1 == 0) {
      memset(local_80,0xaa,0x48);
      QRhiReadbackResult::QRhiReadbackResult(in_stack_fffffffffffffe60);
      local_81 = 0;
      local_82 = 0;
      ensureTexture(this_01,(bool *)changed);
      if ((in_RSI->colorTexture != (QRhiTexture *)0x0) ||
         (in_RSI->msaaColorBuffer != (QRhiRenderBuffer *)0x0)) {
        local_131 = true;
        if ((local_82 & 1) != 0) {
          local_131 = invokeInitialize(this_00,(QRhiCommandBuffer *)pQVar4);
        }
        if (local_131 != false) {
          (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1a8))(pQVar3,local_30);
        }
        pQVar5 = (QRhiReadbackDescription *)QRhi::nextResourceUpdateBatch();
        local_b0._32_8_ = &local_81;
        std::function<void()>::operator=
                  ((function<void_()> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (anon_class_8_1_2b998375 *)in_stack_fffffffffffffe60);
        if (in_RSI->resolveTexture == (QRhiTexture *)0x0) {
          local_180 = in_RSI->colorTexture;
        }
        else {
          local_180 = in_RSI->resolveTexture;
        }
        QRhiReadbackDescription::QRhiReadbackDescription
                  ((QRhiReadbackDescription *)local_b0,local_180);
        QRhiResourceUpdateBatch::readBackTexture(pQVar5,(QRhiReadbackResult *)local_b0);
        orient.i = (Int)((ulong)pQVar5 >> 0x20);
        QRhiCommandBuffer::resourceUpdate(local_30);
      }
      pQVar4 = in_RSI->rhi;
      memset(local_b4,0,4);
      QFlags<QRhi::EndFrameFlag>::QFlags((QFlags<QRhi::EndFrameFlag> *)0x349639);
      QRhi::endOffscreenFrame((QFlags_conflict1 *)pQVar4);
      if ((local_81 & 1) != 0) {
        local_144 = Format_RGBA8888;
        switch(in_RSI->widgetTextureFormat) {
        case RGBA8:
          break;
        case RGBA16F:
          local_144 = Format_RGBA16FPx4;
          break;
        case RGBA32F:
          local_144 = Format_RGBA32FPx4;
          break;
        case RGB10A2:
          local_144 = Format_BGR30;
        }
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffe60 =
             (QRhiReadbackResult *)QByteArray::constData((QByteArray *)0x3496e8);
        iVar1 = QSize::width((QSize *)0x3496fe);
        iVar2 = QSize::height((QSize *)0x349713);
        flags = 0;
        QImage::QImage((QImage *)&local_d0,(uchar *)in_stack_fffffffffffffe60,iVar1,iVar2,local_144,
                       (_func_void_void_ptr *)0x0,(void *)0x0);
        *(undefined1 **)&this_00->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)&(this_00->super_QWidgetPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)&(this_00->super_QWidgetPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
        QImage::QImage((QImage *)this_00);
        uVar6 = QRhi::isYUpInFramebuffer();
        if ((uVar6 & 1) == 0) {
          QRect::QRect((QRect *)in_stack_fffffffffffffe60);
          QImage::copy((QRect *)local_108);
          QImage::operator=((QImage *)CONCAT44(iVar1,in_stack_fffffffffffffe68),
                            (QImage *)in_stack_fffffffffffffe60);
          QImage::~QImage(local_108);
        }
        else {
          QFlags<Qt::Orientation>::QFlags
                    ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe60,flags);
          QImage::flipped((QImage *)pQVar4,(Orientations)orient.i);
          QImage::operator=((QImage *)CONCAT44(iVar1,in_stack_fffffffffffffe68),
                            (QImage *)in_stack_fffffffffffffe60);
          QImage::~QImage(local_e8);
        }
        dVar7 = (double)QPaintDevice::devicePixelRatio();
        QImage::setDevicePixelRatio(dVar7);
        QImage::~QImage((QImage *)&local_d0);
      }
      QRhiReadbackResult::~QRhiReadbackResult(in_stack_fffffffffffffe60);
    }
    else {
      QImage::QImage((QImage *)this_00);
    }
  }
  else {
    QImage::QImage((QImage *)this_00);
  }
LAB_0034986f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QImage QRhiWidgetPrivate::grabFramebuffer()
{
    Q_Q(QRhiWidget);
    if (noSize)
        return QImage();

    ensureRhi();
    if (!rhi) {
        // The widget (and its parent chain, if any) may not be shown at
        // all, yet one may still want to use it for grabs. This is
        // ridiculous of course because the rendering infrastructure is
        // tied to the top-level widget that initializes upon expose, but
        // it has to be supported.
        offscreenRenderer.setConfig(config);
        // no window passed in, so no swapchain, but we get a functional QRhi which we own
        offscreenRenderer.create();
        rhi = offscreenRenderer.rhi();
        if (!rhi) {
            qWarning("QRhiWidget: Failed to create dedicated QRhi for grabbing");
            emit q->renderFailed();
            return QImage();
        }
    }

    QRhiCommandBuffer *cb = nullptr;
    if (rhi->beginOffscreenFrame(&cb) != QRhi::FrameOpSuccess)
        return QImage();

    QRhiReadbackResult readResult;
    bool readCompleted = false;
    bool needsInit = false;
    ensureTexture(&needsInit);

    if (colorTexture || msaaColorBuffer) {
        bool canRender = true;
        if (needsInit)
            canRender = invokeInitialize(cb);
        if (canRender)
            q->render(cb);

        QRhiResourceUpdateBatch *readbackBatch = rhi->nextResourceUpdateBatch();
        readResult.completed = [&readCompleted] { readCompleted = true; };
        readbackBatch->readBackTexture(resolveTexture ? resolveTexture : colorTexture, &readResult);
        cb->resourceUpdate(readbackBatch);
    }

    rhi->endOffscreenFrame();

    if (readCompleted) {
        QImage::Format imageFormat = QImage::Format_RGBA8888;
        switch (widgetTextureFormat) {
        case QRhiWidget::TextureFormat::RGBA8:
            break;
        case QRhiWidget::TextureFormat::RGBA16F:
            imageFormat = QImage::Format_RGBA16FPx4;
            break;
        case QRhiWidget::TextureFormat::RGBA32F:
            imageFormat = QImage::Format_RGBA32FPx4;
            break;
        case QRhiWidget::TextureFormat::RGB10A2:
            imageFormat = QImage::Format_BGR30;
            break;
        }
        QImage wrapperImage(reinterpret_cast<const uchar *>(readResult.data.constData()),
                            readResult.pixelSize.width(), readResult.pixelSize.height(),
                            imageFormat);
        QImage result;
        if (rhi->isYUpInFramebuffer())
            result = wrapperImage.flipped();
        else
            result = wrapperImage.copy();
        result.setDevicePixelRatio(q->devicePixelRatio());
        return result;
    } else {
        Q_UNREACHABLE();
    }

    return QImage();
}